

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboteqInterface.cpp
# Opt level: O2

int connectroboteqinterface(RS232PORT *pRoboteqInterfacePseudoRS232Port)

{
  int iVar1;
  
  iVar1 = OpenRS232Port(pRoboteqInterfacePseudoRS232Port,szRoboteqInterfacePath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(pRoboteqInterfacePseudoRS232Port,RoboteqInterfaceBaudRate,'\0',0,
                                '\b','\0',RoboteqInterfaceTimeout);
    if (iVar1 == 0) {
      puts("RoboteqInterface connected.");
      return 0;
    }
    puts("Unable to connect to a RoboteqInterface.");
    CloseRS232Port(pRoboteqInterfacePseudoRS232Port);
  }
  else {
    puts("Unable to connect to a RoboteqInterface.");
  }
  return 1;
}

Assistant:

int connectroboteqinterface(RS232PORT* pRoboteqInterfacePseudoRS232Port)
{
	if (OpenRS232Port(pRoboteqInterfacePseudoRS232Port, szRoboteqInterfacePath) != EXIT_SUCCESS) 
	{
		printf("Unable to connect to a RoboteqInterface.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(pRoboteqInterfacePseudoRS232Port, RoboteqInterfaceBaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)RoboteqInterfaceTimeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RoboteqInterface.\n");
		CloseRS232Port(pRoboteqInterfacePseudoRS232Port);
		return EXIT_FAILURE;
	}

	printf("RoboteqInterface connected.\n");

	return EXIT_SUCCESS;
}